

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP4Reader::OpenFiles
          (BP4Reader *this,TimePoint *timeoutInstant,Seconds *pollSeconds,Seconds *timeoutSeconds)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  duration<double,_std::ratio<1L,_1L>_> *in_RCX;
  TransportMan *in_RDI;
  string metadataFile;
  string metadataIndexFile;
  string lasterrmsg;
  size_t flag;
  string *in_stack_fffffffffffff938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff940;
  allocator *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff950;
  allocator_type *in_stack_fffffffffffff968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff980;
  int in_stack_fffffffffffff984;
  string *in_stack_fffffffffffff988;
  string *in_stack_fffffffffffff990;
  string *activity;
  BP4Base *in_stack_fffffffffffff998;
  string *source;
  string *in_stack_fffffffffffff9a0;
  string *in_stack_fffffffffffff9e0;
  BP4Base *in_stack_fffffffffffff9e8;
  TransportMan *this_00;
  TransportMan *local_608;
  string *local_5a0;
  string *in_stack_fffffffffffffa68;
  Seconds *pollSeconds_00;
  string *timeoutInstant_00;
  __node_base *fileNames;
  BP4Reader *in_stack_fffffffffffffa90;
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [39];
  allocator local_4c9;
  string local_4c8 [39];
  undefined1 local_4a1 [40];
  allocator local_479;
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [39];
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [39];
  undefined1 local_341 [33];
  string local_320 [32];
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [39];
  undefined1 local_2b1 [40];
  undefined1 local_289 [33];
  string local_268 [32];
  string local_248 [32];
  string local_228 [39];
  undefined1 local_201 [40];
  undefined1 local_1d9 [40];
  undefined1 local_1b1 [40];
  allocator local_189;
  string local_188 [40];
  string *local_160;
  undefined1 local_158 [40];
  _Prime_rehash_policy local_130 [2];
  Comm *local_110;
  duration<double,std::ratio<1l,1l>> local_108 [16];
  IO *local_f8;
  duration<double,std::ratio<1l,1l>> local_f0 [8];
  string local_e8 [35];
  Seconds local_c5;
  string *local_b8;
  string local_b0 [32];
  string *local_90;
  undefined8 local_88;
  string local_68 [32];
  string local_48 [32];
  string *local_28;
  duration<double,_std::ratio<1L,_1L>_> *local_20;
  
  local_28 = (string *)0x1;
  local_20 = in_RCX;
  std::__cxx11::string::string(local_48);
  if (*(int *)((long)&in_RDI[2].m_Transports._M_h._M_rehash_policy._M_next_resize +
              *(long *)(in_RDI[2].m_Transports._M_h._M_element_count - 0x20)) == 0) {
    timeoutInstant_00 = local_68;
    adios2::format::BP4Base::GetBPMetadataIndexFileName
              (in_stack_fffffffffffff998,in_stack_fffffffffffff990);
    fileNames = &in_RDI[0x15].m_Transports._M_h._M_before_begin;
    local_b8 = local_b0;
    std::__cxx11::string::string(local_b8,timeoutInstant_00);
    local_90 = local_b0;
    local_88 = 1;
    pollSeconds_00 = &local_c5;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0xa1c32b);
    __l._M_len._0_4_ = in_stack_fffffffffffff980;
    __l._M_array = in_stack_fffffffffffff978;
    __l._M_len._4_4_ = in_stack_fffffffffffff984;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff970,__l,in_stack_fffffffffffff968);
    psVar2 = (string *)
             OpenWithTimeout(in_stack_fffffffffffffa90,in_RDI,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)fileNames,(TimePoint *)timeoutInstant_00,pollSeconds_00,
                             in_stack_fffffffffffffa68);
    local_28 = psVar2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffff950);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0xa1c3bb);
    local_5a0 = (string *)&local_90;
    do {
      local_5a0 = local_5a0 + -0x20;
      std::__cxx11::string::~string(local_5a0);
    } while (local_5a0 != local_b0);
    if (local_28 == (string *)0x0) {
      adios2::format::BP4Base::GetBPMetadataFileName
                (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
      local_f8 = (IO *)0x0;
      std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>
                (local_f0,(double *)&local_f8);
      bVar1 = std::chrono::operator==
                        ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff950,
                         (duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff948);
      if (bVar1) {
        local_110 = (Comm *)0x4014000000000000;
        std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>
                  (local_108,(double *)&local_110);
        std::chrono::duration<double,std::ratio<1l,1000000000l>>::
        duration<double,std::ratio<1l,1l>,void>
                  ((duration<double,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff950,
                   (duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff948);
        std::chrono::
        time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
        ::operator+=((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffff940,(duration *)in_stack_fffffffffffff938);
      }
      local_160 = (string *)local_158;
      std::__cxx11::string::string(local_160,local_e8);
      local_158._32_8_ = local_158;
      local_130[0]._M_max_load_factor = 1.4013e-45;
      local_130[0]._4_4_ = 0;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0xa1c68b);
      __l_00._M_len._0_4_ = in_stack_fffffffffffff980;
      __l_00._M_array = in_stack_fffffffffffff978;
      __l_00._M_len._4_4_ = in_stack_fffffffffffff984;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff970,__l_00,in_stack_fffffffffffff968);
      local_28 = (string *)
                 OpenWithTimeout(in_stack_fffffffffffffa90,in_RDI,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)fileNames,(TimePoint *)timeoutInstant_00,pollSeconds_00,psVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffff950);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0xa1c71b);
      this_00 = (TransportMan *)local_158;
      local_608 = (TransportMan *)(local_158 + 0x20);
      do {
        local_608 = (TransportMan *)&local_608[-1].m_Transports._M_h._M_rehash_policy._M_next_resize
        ;
        std::__cxx11::string::~string((string *)local_608);
      } while (local_608 != this_00);
      if (local_28 != (string *)0x0) {
        transportman::TransportMan::CloseFiles(this_00,(int)((ulong)local_608 >> 0x20));
      }
      std::__cxx11::string::~string(local_e8);
    }
    std::__cxx11::string::~string(local_68);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"wait for rank 0 to open...",&local_189);
  helper::Comm::Barrier((Comm *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  local_28 = (string *)
             helper::Comm::BroadcastValue<unsigned_long>
                       ((Comm *)in_stack_fffffffffffff990,(unsigned_long *)in_stack_fffffffffffff988
                        ,in_stack_fffffffffffff984);
  if (local_28 == (string *)0x2) {
    if ((*(int *)((long)&in_RDI[2].m_Transports._M_h._M_rehash_policy._M_next_resize +
                 *(long *)(in_RDI[2].m_Transports._M_h._M_element_count - 0x20)) == 0) &&
       (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
      psVar2 = (string *)local_1b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_1b1 + 1),"Engine",(allocator *)psVar2);
      source = (string *)local_1d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_1d9 + 1),"BP4Reader",(allocator *)source);
      activity = (string *)local_201;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_201 + 1),"OpenFiles",(allocator *)activity);
      std::operator+((char *)in_stack_fffffffffffff988,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
      std::operator+(in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
      std::operator+(in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (psVar2,source,activity,in_stack_fffffffffffff988,in_stack_fffffffffffff984);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string((string *)(local_201 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_201);
      std::__cxx11::string::~string((string *)(local_1d9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1d9);
      std::__cxx11::string::~string((string *)(local_1b1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1b1);
    }
    else {
      psVar2 = (string *)local_289;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_289 + 1),"Engine",(allocator *)psVar2);
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_2b1 + 1),"BP4Reader",(allocator *)pbVar5);
      paVar4 = &local_2d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2d8,"OpenFiles",paVar4);
      std::operator+((char *)psVar2,pbVar5);
      std::operator+(in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (in_stack_fffffffffffff9a0,(string *)in_stack_fffffffffffff998,
                 in_stack_fffffffffffff990,psVar2,(int)((ulong)pbVar5 >> 0x20));
      std::__cxx11::string::~string(local_300);
      std::__cxx11::string::~string(local_320);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      std::__cxx11::string::~string((string *)(local_2b1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_2b1);
      std::__cxx11::string::~string((string *)(local_289 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_289);
    }
  }
  else if (local_28 == (string *)0x1) {
    if (*(int *)((long)&in_RDI[2].m_Transports._M_h._M_rehash_policy._M_next_resize +
                *(long *)(in_RDI[2].m_Transports._M_h._M_element_count - 0x20)) == 0) {
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_341;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_341 + 1),"Engine",(allocator *)pbVar5);
      paVar4 = &local_369;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_368,"BP4Reader",paVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_390,"OpenFiles",&local_391);
      std::operator+((char *)in_stack_fffffffffffff988,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
      std::operator+(in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_20);
      std::__cxx11::to_string((double)in_stack_fffffffffffff948);
      std::operator+(in_stack_fffffffffffff978,pbVar5);
      std::operator+(in_stack_fffffffffffff948,(char *)in_stack_fffffffffffff940);
      std::operator+(in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (in_stack_fffffffffffff9a0,(string *)in_stack_fffffffffffff998,
                 in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff984);
      std::__cxx11::string::~string(local_3b8);
      std::__cxx11::string::~string(local_3d8);
      std::__cxx11::string::~string(local_3f8);
      std::__cxx11::string::~string(local_458);
      std::__cxx11::string::~string(local_418);
      std::__cxx11::string::~string(local_438);
      std::__cxx11::string::~string(local_390);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
      std::__cxx11::string::~string(local_368);
      std::allocator<char>::~allocator((allocator<char> *)&local_369);
      std::__cxx11::string::~string((string *)(local_341 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_341);
    }
    else {
      paVar4 = &local_479;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_478,"Engine",paVar4);
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_4a1 + 1),"BP4Reader",(allocator *)pbVar5);
      paVar4 = &local_4c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4c8,"OpenFiles",paVar4);
      std::operator+((char *)in_stack_fffffffffffff988,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980));
      std::operator+(pbVar5,(char *)paVar4);
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_20);
      std::__cxx11::to_string((double)pbVar5);
      std::operator+(in_stack_fffffffffffff978,in_stack_fffffffffffff970);
      std::operator+(pbVar5,(char *)paVar4);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (in_stack_fffffffffffff9a0,(string *)in_stack_fffffffffffff998,
                 in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff984);
      std::__cxx11::string::~string(local_4f0);
      std::__cxx11::string::~string(local_510);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffa90);
      std::__cxx11::string::~string(local_530);
      std::__cxx11::string::~string(local_550);
      std::__cxx11::string::~string(local_4c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
      std::__cxx11::string::~string((string *)(local_4a1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_4a1);
      std::__cxx11::string::~string(local_478);
      std::allocator<char>::~allocator((allocator<char> *)&local_479);
    }
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void BP4Reader::OpenFiles(TimePoint &timeoutInstant, const Seconds &pollSeconds,
                          const Seconds &timeoutSeconds)
{
    /* Poll */
    size_t flag = 1; // 0 = OK, opened file, 1 = timeout, 2 = error
    std::string lasterrmsg;
    if (m_BP4Deserializer.m_RankMPI == 0)
    {
        /* Open the metadata index table */
        const std::string metadataIndexFile(m_BP4Deserializer.GetBPMetadataIndexFileName(m_Name));
        flag = OpenWithTimeout(m_MDIndexFileManager, {metadataIndexFile}, timeoutInstant,
                               pollSeconds, lasterrmsg);
        if (flag == 0)
        {
            /* Open the metadata file */
            const std::string metadataFile(m_BP4Deserializer.GetBPMetadataFileName(m_Name));

            /* We found md.idx. If we don't find md.0 immediately  we should
             * wait a little bit hoping for the file system to catch up.
             * This slows down finding the error in file reading mode but
             * it will be more robust in streaming mode
             */
            if (timeoutSeconds == Seconds(0.0))
            {
                timeoutInstant += Seconds(5.0);
            }

            flag = OpenWithTimeout(m_MDFileManager, {metadataFile}, timeoutInstant, pollSeconds,
                                   lasterrmsg);
            if (flag != 0)
            {
                /* Close the metadata index table */
                m_MDIndexFileManager.CloseFiles();
            }
        }
    }
    m_Comm.Barrier("wait for rank 0 to open...");
    flag = m_Comm.BroadcastValue(flag, 0);
    if (flag == 2)
    {
        if (m_BP4Deserializer.m_RankMPI == 0 && !lasterrmsg.empty())
        {
            helper::Throw<std::ios_base::failure>("Engine", "BP4Reader", "OpenFiles",
                                                  "File " + m_Name +
                                                      " cannot be opened: " + lasterrmsg);
        }
        else
        {
            helper::Throw<std::ios_base::failure>("Engine", "BP4Reader", "OpenFiles",
                                                  "File " + m_Name + " cannot be opened");
        }
    }
    else if (flag == 1)
    {
        if (m_BP4Deserializer.m_RankMPI == 0)
        {
            helper::Throw<std::ios_base::failure>(
                "Engine", "BP4Reader", "OpenFiles",
                "File " + m_Name + " could not be found within the " +
                    std::to_string(timeoutSeconds.count()) + "s timeout: " + lasterrmsg);
        }
        else
        {
            helper::Throw<std::ios_base::failure>(
                "Engine", "BP4Reader", "OpenFiles",
                "File " + m_Name + " could not be found within the " +
                    std::to_string(timeoutSeconds.count()) + "s timeout");
        }
    }

    /* At this point we may have an empty index table.
     * The writer has created the file but no content may have been stored yet.
     */
}